

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::CaseCheck,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  bool bVar3;
  
  (__return_storage_ptr__->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    Read<duckdb::CaseCheck>((Deserializer *)&stack0xffffffffffffffd0);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&__return_storage_ptr__->
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,
               (CaseCheck *)&stack0xffffffffffffffd0);
    CaseCheck::~CaseCheck((CaseCheck *)&stack0xffffffffffffffd0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}